

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPMS_SESSION_AUDIT_INFO_Unmarshal(TPMS_SESSION_AUDIT_INFO *target,BYTE **buffer,INT32 *size)

{
  TPM_RC TVar1;
  
  TVar1 = UINT8_Unmarshal(&target->exclusiveSession,buffer,size);
  if ((TVar1 == 0) && (TVar1 = 0x84, target->exclusiveSession < 2)) {
    TVar1 = 0;
  }
  if (TVar1 != 0) {
    return TVar1;
  }
  TVar1 = TPM2B_DIGEST_Unmarshal(&target->sessionDigest,buffer,size);
  return TVar1;
}

Assistant:

TPM_RC
TPMS_SESSION_AUDIT_INFO_Unmarshal(TPMS_SESSION_AUDIT_INFO *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPMI_YES_NO_Unmarshal((TPMI_YES_NO *)&(target->exclusiveSession), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_DIGEST_Unmarshal((TPM2B_DIGEST *)&(target->sessionDigest), buffer, size);
    return result;
}